

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O0

MPP_RET h265e_vps_write(H265eVps *vps,H265eStream *s)

{
  RK_U32 RVar1;
  TimingInfo *timingInfo;
  uint local_20;
  RK_U32 opsIdx;
  RK_U32 i;
  RK_S32 vps_byte_start;
  H265eStream *s_local;
  H265eVps *vps_local;
  
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_vps_write");
  }
  h265e_stream_realign(s);
  RVar1 = (s->enc_stream).byte_cnt;
  h265e_stream_write_with_log(s,vps->m_VPSId,4,"vps_video_parameter_set_id");
  h265e_stream_write_with_log(s,3,2,"vps_reserved_three_2bits");
  h265e_stream_write_with_log(s,0,6,"vps_reserved_zero_6bits");
  h265e_stream_write_with_log(s,vps->m_maxTLayers - 1,3,"vps_max_sub_layers_minus1");
  h265e_stream_write1_with_log(s,vps->m_bTemporalIdNestingFlag,"vps_temporal_id_nesting_flag");
  h265e_stream_write_with_log(s,0xffff,0x10,"vps_reserved_ffff_16bits");
  codePTL(s,&vps->m_ptl,1,vps->m_maxTLayers - 1);
  h265e_stream_write1_with_log(s,1,"vps_sub_layer_ordering_info_present_flag");
  for (local_20 = 0; local_20 <= vps->m_maxTLayers - 1; local_20 = local_20 + 1) {
    h265e_stream_write_ue_with_log
              (s,vps->m_maxDecPicBuffering[local_20] - 1,"vps_max_dec_pic_buffering_minus1[i]");
    h265e_stream_write_ue_with_log(s,vps->m_numReorderPics[local_20],"vps_num_reorder_pics[i]");
    h265e_stream_write_ue_with_log
              (s,vps->m_maxLatencyIncrease[local_20],"vps_max_latency_increase_plus1[i]");
  }
  if ((1 < vps->m_numHrdParameters) &&
     (_mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "vps->m_numHrdParameters <= 1","h265e_vps_write",0x144),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((vps->m_maxNuhReservedZeroLayerId != 0) &&
     (_mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "vps->m_maxNuhReservedZeroLayerId < 1","h265e_vps_write",0x145),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  h265e_stream_write_with_log
            (s,vps->m_maxNuhReservedZeroLayerId,6,"vps_max_nuh_reserved_zero_layer_id");
  vps->m_numOpSets = 1;
  h265e_stream_write_ue_with_log(s,vps->m_numOpSets - 1,"vps_max_op_sets_minus1");
  for (timingInfo._4_4_ = 1; timingInfo._4_4_ <= vps->m_numOpSets - 1;
      timingInfo._4_4_ = timingInfo._4_4_ + 1) {
    for (local_20 = 0; local_20 <= vps->m_maxNuhReservedZeroLayerId; local_20 = local_20 + 1) {
      vps->m_layerIdIncludedFlag[(ulong)timingInfo._4_4_ + (ulong)local_20][0] = 1;
      h265e_stream_write1_with_log
                (s,(uint)(vps->m_layerIdIncludedFlag[(ulong)timingInfo._4_4_ + (ulong)local_20][0]
                         != 0),"layer_id_included_flag[opsIdx][i]");
    }
  }
  h265e_stream_write1_with_log
            (s,(vps->m_timingInfo).m_timingInfoPresentFlag,"vps_timing_info_present_flag");
  if ((vps->m_timingInfo).m_timingInfoPresentFlag != 0) {
    h265e_stream_write_with_log(s,(vps->m_timingInfo).m_numUnitsInTick,0x20,"vps_num_units_in_tick")
    ;
    h265e_stream_write_with_log(s,(vps->m_timingInfo).m_timeScale,0x20,"vps_time_scale");
    h265e_stream_write1_with_log
              (s,(vps->m_timingInfo).m_pocProportionalToTimingFlag,
               "vps_poc_proportional_to_timing_flag");
    if ((vps->m_timingInfo).m_pocProportionalToTimingFlag != 0) {
      h265e_stream_write_ue_with_log
                (s,(vps->m_timingInfo).m_numTicksPocDiffOneMinus1,
                 "vps_num_ticks_poc_diff_one_minus1");
    }
    vps->m_numHrdParameters = 0;
    h265e_stream_write_ue_with_log(s,vps->m_numHrdParameters,"vps_num_hrd_parameters");
  }
  h265e_stream_write1_with_log(s,0,"vps_extension_flag");
  h265e_stream_rbsp_trailing(s);
  h265e_stream_flush(s);
  if ((h265e_debug & 0x200) != 0) {
    _mpp_log_l(4,"h265e_header_gen","write pure vps head size: %d bits",(char *)0x0,
               (ulong)(((s->enc_stream).byte_cnt - RVar1) * 8));
  }
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_vps_write");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET h265e_vps_write(H265eVps *vps, H265eStream *s)
{
    RK_S32 vps_byte_start = 0;
    RK_U32 i, opsIdx;

    h265e_dbg_func("enter\n");
    h265e_stream_realign(s);
    vps_byte_start = s->enc_stream.byte_cnt;
    h265e_stream_write_with_log(s, vps->m_VPSId, 4, "vps_video_parameter_set_id");
    h265e_stream_write_with_log(s, 3, 2, "vps_reserved_three_2bits");
    h265e_stream_write_with_log(s, 0, 6, "vps_reserved_zero_6bits");
    h265e_stream_write_with_log(s, vps->m_maxTLayers - 1, 3, "vps_max_sub_layers_minus1");
    h265e_stream_write1_with_log(s, vps->m_bTemporalIdNestingFlag, "vps_temporal_id_nesting_flag");

    h265e_stream_write_with_log(s, 0xffff, 16, "vps_reserved_ffff_16bits");

    codePTL(s, &vps->m_ptl, 1, vps->m_maxTLayers - 1);

    h265e_stream_write1_with_log(s, 1, "vps_sub_layer_ordering_info_present_flag");
    for (i = 0; i <= vps->m_maxTLayers - 1; i++) {
        h265e_stream_write_ue_with_log(s, vps->m_maxDecPicBuffering[i] - 1, "vps_max_dec_pic_buffering_minus1[i]");
        h265e_stream_write_ue_with_log(s, vps->m_numReorderPics[i],  "vps_num_reorder_pics[i]");
        h265e_stream_write_ue_with_log(s, vps->m_maxLatencyIncrease[i], "vps_max_latency_increase_plus1[i]");
    }

    mpp_assert(vps->m_numHrdParameters <= MAX_VPS_NUM_HRD_PARAMETERS);
    mpp_assert(vps->m_maxNuhReservedZeroLayerId < MAX_VPS_NUH_RESERVED_ZERO_LAYER_ID_PLUS1);
    h265e_stream_write_with_log(s, vps->m_maxNuhReservedZeroLayerId, 6, "vps_max_nuh_reserved_zero_layer_id");
    vps->m_numOpSets = 1;
    h265e_stream_write_ue_with_log(s, vps->m_numOpSets - 1, "vps_max_op_sets_minus1");
    for (opsIdx = 1; opsIdx <= (vps->m_numOpSets - 1); opsIdx++) {
        // Operation point set
        for (i = 0; i <= vps->m_maxNuhReservedZeroLayerId; i++) {
            // Only applicable for version 1
            vps->m_layerIdIncludedFlag[opsIdx][i] = 1;
            h265e_stream_write1_with_log(s, vps->m_layerIdIncludedFlag[opsIdx][i] ? 1 : 0, "layer_id_included_flag[opsIdx][i]");
        }
    }

    TimingInfo *timingInfo = &vps->m_timingInfo;
    h265e_stream_write1_with_log(s, timingInfo->m_timingInfoPresentFlag, "vps_timing_info_present_flag");
    if (timingInfo->m_timingInfoPresentFlag) {
        h265e_stream_write_with_log(s, timingInfo->m_numUnitsInTick, 32,           "vps_num_units_in_tick");
        h265e_stream_write_with_log(s, timingInfo->m_timeScale,      32,           "vps_time_scale");
        h265e_stream_write1_with_log(s, timingInfo->m_pocProportionalToTimingFlag,  "vps_poc_proportional_to_timing_flag");
        if (timingInfo->m_pocProportionalToTimingFlag) {
            h265e_stream_write_ue_with_log(s, timingInfo->m_numTicksPocDiffOneMinus1,   "vps_num_ticks_poc_diff_one_minus1");
        }
        vps->m_numHrdParameters = 0;
        h265e_stream_write_ue_with_log(s, vps->m_numHrdParameters,                 "vps_num_hrd_parameters");
#if 0
        if (vps->m_numHrdParameters > 0) {
            vps->createHrdParamBuffer();
        }
        for (uint32_t i = 0; i < vps->getNumHrdParameters(); i++) {
            // Only applicable for version 1
            vps->setHrdOpSetIdx(0, i);
            h265e_stream_write_ue_with_log(s, vps->getHrdOpSetIdx(i),                "hrd_op_set_idx");
            if (i > 0) {
                h265e_stream_write1_with_log(s, vps->getCprmsPresentFlag(i) ? 1 : 0, "cprms_present_flag[i]");
            }
            codeHrdParameters(vps->getHrdParameters(i), vps->getCprmsPresentFlag(i), vps->getMaxTLayers() - 1);
        }
#endif
    }
    h265e_stream_write1_with_log(s, 0,                     "vps_extension_flag");
    h265e_stream_rbsp_trailing(s);
    h265e_stream_flush(s);
    h265e_dbg(H265E_DBG_HEADER, "write pure vps head size: %d bits", (s->enc_stream.byte_cnt - vps_byte_start) * 8);
    //future extensions here..
    h265e_dbg_func("leave\n");
    return MPP_OK;
}